

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkTimePrepare(Abc_Ntk_t *pNtk)

{
  void **ppvVar1;
  float *pfVar2;
  undefined4 *puVar3;
  int iVar4;
  int iVar5;
  Abc_ManTime_t *pAVar6;
  Abc_Obj_t *pAVar7;
  int local_2c;
  int i;
  Abc_Time_t *pTime;
  Abc_Time_t **ppTimes;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    pAVar6 = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = pAVar6;
    Abc_NtkTimeInitialize(pNtk,(Abc_Ntk_t *)0x0);
  }
  else {
    pAVar6 = pNtk->pManTime;
    iVar4 = Abc_NtkObjNumMax(pNtk);
    Abc_ManTimeExpand(pAVar6,iVar4,0);
    ppvVar1 = pNtk->pManTime->vArrs->pArray;
    for (local_2c = 0; iVar4 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar4; local_2c = local_2c + 1)
    {
      pAVar7 = Abc_NtkObj(pNtk,local_2c);
      if ((pAVar7 != (Abc_Obj_t *)0x0) && (iVar4 = Abc_ObjIsNode(pAVar7), iVar4 != 0)) {
        pfVar2 = (float *)ppvVar1[pAVar7->Id];
        iVar4 = Abc_ObjFaninNum(pAVar7);
        iVar5 = 0;
        if (iVar4 != 0) {
          iVar5 = -1000000000;
        }
        *pfVar2 = (float)iVar5;
        pfVar2[1] = (float)iVar5;
      }
    }
    for (local_2c = 0; iVar4 = Abc_NtkCoNum(pNtk), local_2c < iVar4; local_2c = local_2c + 1) {
      pAVar7 = Abc_NtkCo(pNtk,local_2c);
      puVar3 = (undefined4 *)ppvVar1[pAVar7->Id];
      *puVar3 = 0xce6e6b28;
      puVar3[1] = 0xce6e6b28;
    }
    ppvVar1 = pNtk->pManTime->vReqs->pArray;
    for (local_2c = 0; iVar4 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar4; local_2c = local_2c + 1)
    {
      pAVar7 = Abc_NtkObj(pNtk,local_2c);
      if ((pAVar7 != (Abc_Obj_t *)0x0) && (iVar4 = Abc_ObjIsNode(pAVar7), iVar4 != 0)) {
        puVar3 = (undefined4 *)ppvVar1[pAVar7->Id];
        *puVar3 = 0x4e6e6b28;
        puVar3[1] = 0x4e6e6b28;
      }
    }
    for (local_2c = 0; iVar4 = Abc_NtkCiNum(pNtk), local_2c < iVar4; local_2c = local_2c + 1) {
      pAVar7 = Abc_NtkCi(pNtk,local_2c);
      puVar3 = (undefined4 *)ppvVar1[pAVar7->Id];
      *puVar3 = 0x4e6e6b28;
      puVar3[1] = 0x4e6e6b28;
    }
  }
  return;
}

Assistant:

void Abc_NtkTimePrepare( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    Abc_Time_t ** ppTimes, * pTime;
    int i;
    // if there is no timing manager, allocate and initialize
    if ( pNtk->pManTime == NULL )
    {
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
        Abc_NtkTimeInitialize( pNtk, NULL );
        return;
    }
    // if timing manager is given, expand it if necessary
    Abc_ManTimeExpand( pNtk->pManTime, Abc_NtkObjNumMax(pNtk), 0 );
    // clean arrivals except for PIs
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vArrs->pArray;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall = pTime->Rise = Abc_ObjFaninNum(pObj) ? -ABC_INFINITY : 0; // set contant node arrivals to zero
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall = pTime->Rise = -ABC_INFINITY;
    }
    // clean required except for POs
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vReqs->pArray;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall = pTime->Rise = ABC_INFINITY;
    }
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall = pTime->Rise = ABC_INFINITY;
    }
}